

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_error.c
# Opt level: O0

void l2_parsing_error(l2_parsing_error_type error_type,int lines,int cols,...)

{
  char *pcVar1;
  char in_AL;
  char cVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_2a8;
  undefined8 *local_278;
  undefined8 *local_260;
  undefined8 *local_1d0;
  undefined1 local_108 [24];
  char *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  l2_token *token_p;
  char *token_str2;
  char *token_str;
  uint local_38;
  undefined4 uStack_34;
  char illegal_char;
  va_list va;
  int cols_local;
  int lines_local;
  l2_parsing_error_type error_type_local;
  
  pcVar1 = local_f0;
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  va[0].overflow_arg_area = local_108;
  va[0]._0_8_ = &stack0x00000008;
  uStack_34 = 0x30;
  local_38 = 0x18;
  cVar2 = (char)local_f0;
  local_e8 = in_R8;
  local_e0 = in_R9;
  switch(error_type) {
  case L2_PARSING_ERROR_ILLEGAL_CHARACTER:
    uStack_34 = 0x30;
    local_38 = 0x20;
    local_f0 = (char *)in_RCX;
    token_str._7_1_ = cVar2;
    fprintf(_stderr,anon_var_dwarf_19b3,(ulong)(uint)lines,(ulong)(uint)cols,(ulong)(uint)(int)cVar2
            ,(ulong)(uint)(int)cVar2);
    break;
  case L2_PARSING_ERROR_ILLEGAL_NUMBER_IN_AN_OCTAL_LITERAL:
    uStack_34 = 0x30;
    local_38 = 0x20;
    local_f0 = (char *)in_RCX;
    token_str._7_1_ = cVar2;
    fprintf(_stderr,anon_var_dwarf_19d3,(ulong)(uint)lines,(ulong)(uint)cols,(ulong)(uint)(int)cVar2
           );
    break;
  case L2_PARSING_ERROR_INCOMPLETE_HEX_LITERAL:
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_19e9,(ulong)(uint)lines,(ulong)(uint)cols);
    break;
  case L2_PARSING_ERROR_EMPTY_CHARACTER_LITERAL:
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1a15,(ulong)(uint)lines,(ulong)(uint)cols);
    break;
  case L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL:
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1a1f,(ulong)(uint)lines,(ulong)(uint)cols);
    break;
  case L2_PARSING_ERROR_INCOMPLETE_REAL_LITERAL:
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_19ff,(ulong)(uint)lines,(ulong)(uint)cols);
    break;
  case L2_PARSING_ERROR_MULTI_CHARACTER_IN_SINGLE_CHARACTER_LITERAL:
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1a35,(ulong)(uint)lines,(ulong)(uint)cols);
    break;
  case L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL:
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1a4b,(ulong)(uint)lines,(ulong)(uint)cols);
    break;
  case L2_PARSING_ERROR_UNEXPECTED_TOKEN:
    uStack_34 = 0x30;
    local_38 = 0x20;
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_19bd,(ulong)(uint)lines,(ulong)(uint)cols);
    break;
  case L2_PARSING_ERROR_MISSING_COLON:
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1a61,(ulong)(uint)lines,(ulong)(uint)cols);
    break;
  case L2_PARSING_ERROR_MISSING_SEMICOLON:
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1a77,(ulong)(uint)lines,(ulong)(uint)cols);
    break;
  case L2_PARSING_ERROR_MISSING_RBRACE:
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1a8d,(ulong)(uint)lines,(ulong)(uint)cols);
    break;
  case L2_PARSING_ERROR_MISSING_RP:
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1aa3,(ulong)(uint)lines,(ulong)(uint)cols);
    break;
  case L2_PARSING_ERROR_IDENTIFIER_UNDEFINED:
    uStack_34 = 0x30;
    local_38 = 0x20;
    token_str2 = local_f0;
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1ab9,(ulong)(uint)lines,(ulong)(uint)cols,pcVar1);
    break;
  case L2_PARSING_ERROR_IDENTIFIER_REDEFINED:
    uStack_34 = 0x30;
    local_38 = 0x20;
    token_str2 = local_f0;
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1acf,(ulong)(uint)lines,(ulong)(uint)cols,pcVar1);
    break;
  case L2_PARSING_ERROR_REFERENCE_SYMBOL_BEFORE_INITIALIZATION:
    uStack_34 = 0x30;
    local_38 = 0x20;
    token_str2 = local_f0;
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1ad9,(ulong)(uint)lines,(ulong)(uint)cols,pcVar1);
    break;
  case L2_PARSING_ERROR_INCOMPATIBLE_OPERATION:
    uStack_34 = 0x30;
    local_38 = 0x20;
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1aef,(ulong)(uint)lines,(ulong)(uint)cols,pcVar1);
    if (local_38 < 0x29) {
      local_1d0 = (undefined8 *)((long)(int)local_38 + (long)va[0].overflow_arg_area);
      local_38 = local_38 + 8;
    }
    else {
      local_1d0 = (undefined8 *)va[0]._0_8_;
      va[0]._0_8_ = va[0]._0_8_ + 8;
    }
    token_str2 = (char *)*local_1d0;
    fprintf(_stderr,anon_var_dwarf_1af9,token_str2);
    break;
  case L2_PARSING_ERROR_DIVIDE_BY_ZERO:
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1b0f,(ulong)(uint)lines,(ulong)(uint)cols);
    break;
  case L2_PARSING_ERROR_EXPR_NOT_BOOL:
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1b25,(ulong)(uint)lines,(ulong)(uint)cols);
    break;
  case L2_PARSING_ERROR_LEFT_SIDE_OF_OPERATOR_MUST_BE_A_BOOL_VALUE:
    uStack_34 = 0x30;
    local_38 = 0x20;
    token_str2 = local_f0;
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1b45,(ulong)(uint)lines,(ulong)(uint)cols,pcVar1);
    break;
  case L2_PARSING_ERROR_RIGHT_SIDE_OF_OPERATOR_MUST_BE_A_BOOL_VALUE:
    uStack_34 = 0x30;
    local_38 = 0x20;
    token_str2 = local_f0;
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1b2f,(ulong)(uint)lines,(ulong)(uint)cols,pcVar1);
    break;
  case L2_PARSING_ERROR_LEFT_SIDE_OF_OPERATOR_MUST_BE_A_INTEGER_VALUE:
    uStack_34 = 0x30;
    local_38 = 0x20;
    token_str2 = local_f0;
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1b4f,(ulong)(uint)lines,(ulong)(uint)cols,pcVar1);
    break;
  case L2_PARSING_ERROR_RIGHT_SIDE_OF_OPERATOR_MUST_BE_A_INTEGER_VALUE:
    uStack_34 = 0x30;
    local_38 = 0x20;
    token_str2 = local_f0;
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1b59,(ulong)(uint)lines,(ulong)(uint)cols,pcVar1);
    break;
  case L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE:
    uStack_34 = 0x30;
    local_38 = 0x20;
    token_str2 = local_f0;
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1b63,(ulong)(uint)lines,(ulong)(uint)cols,pcVar1);
    if (local_38 < 0x29) {
      local_260 = (undefined8 *)((long)(int)local_38 + (long)va[0].overflow_arg_area);
      local_38 = local_38 + 8;
    }
    else {
      local_260 = (undefined8 *)va[0]._0_8_;
      va[0]._0_8_ = va[0]._0_8_ + 8;
    }
    token_p = (l2_token *)*local_260;
    fprintf(_stderr,"<%s> \'%s\' ",token_p,token_str2);
    if (local_38 < 0x29) {
      local_278 = (undefined8 *)((long)(int)local_38 + (long)va[0].overflow_arg_area);
      local_38 = local_38 + 8;
    }
    else {
      local_278 = (undefined8 *)va[0]._0_8_;
      va[0]._0_8_ = va[0]._0_8_ + 8;
    }
    token_p = (l2_token *)*local_278;
    fprintf(_stderr,"<%s>\n",token_p);
    break;
  case L2_PARSING_ERROR_UNITARY_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE:
    uStack_34 = 0x30;
    local_38 = 0x20;
    token_str2 = local_f0;
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1b99,(ulong)(uint)lines,(ulong)(uint)cols,pcVar1);
    if (local_38 < 0x29) {
      local_2a8 = (undefined8 *)((long)(int)local_38 + (long)va[0].overflow_arg_area);
      local_38 = local_38 + 8;
    }
    else {
      local_2a8 = (undefined8 *)va[0]._0_8_;
      va[0]._0_8_ = va[0]._0_8_ + 8;
    }
    token_p = (l2_token *)*local_2a8;
    fprintf(_stderr,"\'%s\' <%s>\n",token_str2,token_p);
    break;
  case L2_PARSING_ERROR_INVALID_CONTINUE_IN_CURRENT_CONTEXT:
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1bad,(ulong)(uint)lines,(ulong)(uint)cols);
    break;
  case L2_PARSING_ERROR_INVALID_BREAK_IN_CURRENT_CONTEXT:
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1bb7,(ulong)(uint)lines,(ulong)(uint)cols);
    break;
  case L2_PARSING_ERROR_INVALID_RETURN_IN_CURRENT_CONTEXT:
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1bcd,(ulong)(uint)lines,(ulong)(uint)cols);
    break;
  case L2_PARSING_ERROR_SYMBOL_IS_NOT_PROCEDURE:
    uStack_34 = 0x30;
    local_38 = 0x20;
    token_str2 = local_f0;
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1be3,(ulong)(uint)lines,(ulong)(uint)cols,pcVar1);
    break;
  case L2_PARSING_ERROR_TOO_MANY_PARAMETERS:
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1bf9,(ulong)(uint)lines,(ulong)(uint)cols);
    break;
  case L2_PARSING_ERROR_TOO_FEW_PARAMETERS:
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1c03,(ulong)(uint)lines,(ulong)(uint)cols);
    break;
  case L2_PARSING_ERROR_EXPR_RESULT_WITHOUT_VALUE:
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1c0d,(ulong)(uint)lines,(ulong)(uint)cols);
    break;
  case L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE:
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1c23,(ulong)(uint)lines,(ulong)(uint)cols);
    break;
  case L2_PARSING_ERROR_INCOMPATIBLE_SYMBOL_TYPE:
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1c2d,(ulong)(uint)lines,(ulong)(uint)cols);
    break;
  default:
    local_f0 = (char *)in_RCX;
    fprintf(_stderr,anon_var_dwarf_1c37);
  }
  fprintf(_stderr,anon_var_dwarf_199d);
  l2_clean_before_abort();
  exit(error_type);
}

Assistant:

void _Noreturn l2_parsing_error(const l2_parsing_error_type error_type, int lines, int cols, ...) {

    va_list va;
    va_start(va, cols);

    char illegal_char;
    char *token_str, *token_str2;
    l2_token *token_p;

    switch (error_type) {
        case L2_PARSING_ERROR_ILLEGAL_CHARACTER:
            illegal_char = (char)va_arg(va, int);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t解析到非法字符 \'%c\'(0x%X)\n", lines, cols, illegal_char, illegal_char);
            break;

        case L2_PARSING_ERROR_UNEXPECTED_TOKEN:
            token_p = va_arg(va, l2_token *);
            /*
            switch (token_p->type) {

            }*/
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t解析到非法词法元素\n", lines, cols);
            break;

        case L2_PARSING_ERROR_ILLEGAL_NUMBER_IN_AN_OCTAL_LITERAL:
            illegal_char = (char)va_arg(va, int);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t在八进制字面量中包含了非法数字 \'%c\'\n", lines, cols, illegal_char);
            break;

        case L2_PARSING_ERROR_INCOMPLETE_HEX_LITERAL:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不完整的十六进制字面量\n", lines, cols);
            break;

        case L2_PARSING_ERROR_INCOMPLETE_REAL_LITERAL:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不完整的实数 (real) 字面量\n", lines, cols);
            break;

        case L2_PARSING_ERROR_EMPTY_CHARACTER_LITERAL:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t字符字面量不能为空\n", lines, cols);
            break;

        case L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不完整的字符字面量, 字符字面量应该以单引号 ' 结束\n", lines, cols);
            break;

        case L2_PARSING_ERROR_MULTI_CHARACTER_IN_SINGLE_CHARACTER_LITERAL:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t在单个字符字面量中出现多个字符\n", lines, cols);
            break;

        case L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不完整的字符串字面量, 字符串字面量应该以双引号 \" 结束\n", lines, cols);
            break;

        case L2_PARSING_ERROR_MISSING_COLON:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不完整的条件表达式, 可能缺少冒号 \':\'\n", lines, cols);
            break;

        case L2_PARSING_ERROR_MISSING_SEMICOLON:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t在语句末尾可能缺少了分号\n", lines, cols);
            break;

        case L2_PARSING_ERROR_MISSING_RBRACE:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t缺少块结束符, 右花括号 }\n", lines, cols);
            break;

        case L2_PARSING_ERROR_MISSING_RP:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t缺少右圆括号 \')\'\n", lines, cols);
            break;

        case L2_PARSING_ERROR_IDENTIFIER_UNDEFINED:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t标识符 \'%s\' 未定义\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_IDENTIFIER_REDEFINED:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t标识符 \'%s\' 重定义\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_REFERENCE_SYMBOL_BEFORE_INITIALIZATION:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t符号 \'%s\' 在初始化之前被引用了\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_INCOMPATIBLE_OPERATION:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不兼容的操作 \'%s\' 在 ", lines, cols, token_str);
            token_str = va_arg(va, char *);
            fprintf(stderr, "%s 之上\n", token_str);
            break;

        case L2_PARSING_ERROR_DIVIDE_BY_ZERO:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t试图除以整数 0\n", lines, cols);
            break;

        case L2_PARSING_ERROR_EXPR_NOT_BOOL:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t表达式不是布尔类型 (bool)\n", lines, cols);
            break;

        case L2_PARSING_ERROR_RIGHT_SIDE_OF_OPERATOR_MUST_BE_A_BOOL_VALUE:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t操作符 \'%s\' 的右侧必须是布尔类型 (bool) 的值\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_LEFT_SIDE_OF_OPERATOR_MUST_BE_A_BOOL_VALUE:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t操作符 \'%s\' 的左侧必须是布尔类型 (bool) 的值\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_LEFT_SIDE_OF_OPERATOR_MUST_BE_A_INTEGER_VALUE:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t操作符 \'%s\' 的左侧必须是整数型 (integer) 的值\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_RIGHT_SIDE_OF_OPERATOR_MUST_BE_A_INTEGER_VALUE:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t操作符 \'%s\' 的右侧必须是整数型 (integer) 的值\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t操作符 \'%s\' 作用于不兼容的类型之上, ", lines, cols, token_str);
            token_str2 = va_arg(va, char *);
            fprintf(stderr, "<%s> \'%s\' ", token_str2, token_str);
            token_str2 = va_arg(va, char *);
            fprintf(stderr, "<%s>\n", token_str2);
            break;

        case L2_PARSING_ERROR_UNITARY_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t操作符 \'%s\' 的右侧具有不兼容的类型, ", lines, cols, token_str);
            token_str2 = va_arg(va, char *);
            fprintf(stderr, "\'%s\' <%s>\n", token_str, token_str2);
            break;

        case L2_PARSING_ERROR_INVALID_CONTINUE_IN_CURRENT_CONTEXT:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t在当前的上下文中出现无效的关键字 \'continue\'\n", lines, cols);
            break;

        case L2_PARSING_ERROR_INVALID_BREAK_IN_CURRENT_CONTEXT:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t在当前的上下文中出现无效的关键字 \'break\'\n", lines, cols);
            break;

        case L2_PARSING_ERROR_INVALID_RETURN_IN_CURRENT_CONTEXT:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t在当前的上下文中出现无效的关键字 \'return\'\n", lines, cols);
            break;

        case L2_PARSING_ERROR_SYMBOL_IS_NOT_PROCEDURE:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t符号 \'%s\' 并非过程, 无法进行调用\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_TOO_MANY_PARAMETERS:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t调用过程的参数太多\n", lines, cols);
            break;

        case L2_PARSING_ERROR_TOO_FEW_PARAMETERS:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t调用过程的参数太少\n", lines, cols);
            break;

        case L2_PARSING_ERROR_EXPR_RESULT_WITHOUT_VALUE:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t表达式并不具有任何值\n", lines, cols);
            break;

        case L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不兼容的表达式值类型\n", lines, cols);
            break;

        case L2_PARSING_ERROR_INCOMPATIBLE_SYMBOL_TYPE:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不兼容的符号类型\n", lines, cols);
            break;

        default:
            fprintf(stderr, "L2 脚本解释错误, 出现一个未知错误\n");
    }

    fprintf(stderr, "L2 解释器已异常终止\n");

    va_end(va);
    l2_clean_before_abort();
    exit(error_type);
}